

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O3

lzham_decompress_state_ptr lzham::lzham_lib_decompress_init(lzham_decompress_params *pParams)

{
  int iVar1;
  lzham_uint32 lVar2;
  lzham_bool lVar3;
  lzham_bool lVar4;
  lzham_decompressor *this;
  void *pvVar5;
  long lVar6;
  
  if (((pParams == (lzham_decompress_params *)0x0) || (pParams->m_struct_size != 0x10)) ||
     (pParams->m_dict_size_log2 - 0x1e < 0xfffffff1)) {
LAB_0010ed83:
    this = (lzham_decompressor *)0x0;
  }
  else {
    this = (lzham_decompressor *)lzham_malloc(0x4fa8,(size_t *)0x0);
    if (this == (lzham_decompressor *)0x0) {
      return (lzham_decompress_state_ptr)0x0;
    }
    lzham_decompressor::lzham_decompressor(this);
    lVar2 = pParams->m_dict_size_log2;
    lVar3 = pParams->m_output_unbuffered;
    lVar4 = pParams->m_compute_adler32;
    (this->m_params).m_struct_size = pParams->m_struct_size;
    (this->m_params).m_dict_size_log2 = lVar2;
    (this->m_params).m_output_unbuffered = lVar3;
    (this->m_params).m_compute_adler32 = lVar4;
    if ((this->m_params).m_output_unbuffered == 0) {
      lVar6 = 1L << ((byte)(this->m_params).m_dict_size_log2 & 0x3f);
      pvVar5 = lzham_malloc(lVar6 + 0x1f,(size_t *)0x0);
      if (pvVar5 == (void *)0x0) {
        this->m_pRaw_decomp_buf = (uint8 *)0x0;
        lzham_decompressor::~lzham_decompressor(this);
        lzham_free(this);
        goto LAB_0010ed83;
      }
      iVar1 = (int)lVar6;
      *(int *)((long)pvVar5 + 0xc) = iVar1 + 0xf;
      *(int *)((long)pvVar5 + 8) = -0x10 - iVar1;
      this->m_pRaw_decomp_buf = (uint8 *)((long)pvVar5 + 0x10);
      this->m_pDecomp_buf = (uint8 *)((long)pvVar5 + 0x1fU & 0xfffffffffffffff0);
    }
    else {
      this->m_pRaw_decomp_buf = (uint8 *)0x0;
      this->m_pDecomp_buf = (uint8 *)0x0;
    }
    CLZDecompBase::init_position_slots(&this->m_lzBase,(this->m_params).m_dict_size_log2);
    this->m_state = 0;
    this->m_status = LZHAM_DECOMP_STATUS_NOT_FINISHED;
    this->m_pIn_buf = (uint8 *)0x0;
    this->m_pIn_buf_size = (size_t *)0x0;
    this->m_pOut_buf = (uint8 *)0x0;
    this->m_pOut_buf_size = (size_t *)0x0;
    this->m_no_more_input_bytes_flag = false;
    this->m_pOrig_out_buf = (uint8 *)0x0;
    this->m_orig_out_buf_size = 0;
    this->m_dst_ofs = 0;
    this->m_step = 0;
    this->m_block_step = 0;
    this->m_initial_step = 0;
    this->m_block_index = 0;
    this->m_decomp_adler32 = 1;
  }
  return this;
}

Assistant:

lzham_decompress_state_ptr lzham_lib_decompress_init(const lzham_decompress_params *pParams)
   {
      LZHAM_ASSUME(CLZDecompBase::cMinDictSizeLog2 == LZHAM_MIN_DICT_SIZE_LOG2);
      LZHAM_ASSUME(CLZDecompBase::cMaxDictSizeLog2 == LZHAM_MAX_DICT_SIZE_LOG2_X64);

      if ((!pParams) || (pParams->m_struct_size != sizeof(lzham_decompress_params)))
         return NULL;

      if ((pParams->m_dict_size_log2 < CLZDecompBase::cMinDictSizeLog2) || (pParams->m_dict_size_log2 > CLZDecompBase::cMaxDictSizeLog2))
         return NULL;

      lzham_decompressor *pState = lzham_new<lzham_decompressor>();
      if (!pState)
         return NULL;

      pState->m_params = *pParams;

      if (pState->m_params.m_output_unbuffered)
      {
         pState->m_pRaw_decomp_buf = NULL;
         pState->m_pDecomp_buf = NULL;
      }
      else
      {
         pState->m_pRaw_decomp_buf = lzham_new_array<uint8>(static_cast<uint32>(1U << pState->m_params.m_dict_size_log2) + 15);
         if (!pState->m_pRaw_decomp_buf)
         {
            lzham_delete(pState);
            return NULL;
         }
         pState->m_pDecomp_buf = math::align_up_pointer(pState->m_pRaw_decomp_buf, 16);
      }

      pState->init();

      return pState;
   }